

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int libssh2_agent_get_identity
              (LIBSSH2_AGENT *agent,libssh2_agent_publickey **ext,libssh2_agent_publickey *oprev)

{
  libssh2_agent_publickey *plVar1;
  agent_publickey *prev;
  agent_publickey *node;
  libssh2_agent_publickey *oprev_local;
  libssh2_agent_publickey **ext_local;
  LIBSSH2_AGENT *agent_local;
  
  if ((oprev == (libssh2_agent_publickey *)0x0) || (oprev->node == (void *)0x0)) {
    prev = (agent_publickey *)_libssh2_list_first(&agent->head);
  }
  else {
    prev = (agent_publickey *)_libssh2_list_next((list_node *)oprev->node);
  }
  if (prev != (agent_publickey *)0x0) {
    plVar1 = agent_publickey_to_external(prev);
    *ext = plVar1;
  }
  agent_local._4_4_ = (uint)(prev == (agent_publickey *)0x0);
  return agent_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_agent_get_identity(LIBSSH2_AGENT *agent,
                           struct libssh2_agent_publickey **ext,
                           struct libssh2_agent_publickey *oprev)
{
    struct agent_publickey *node;
    if(oprev && oprev->node) {
        /* we have a starting point */
        struct agent_publickey *prev = oprev->node;

        /* get the next node in the list */
        node = _libssh2_list_next(&prev->node);
    }
    else
        node = _libssh2_list_first(&agent->head);

    if(!node)
        /* no (more) node */
        return 1;

    *ext = agent_publickey_to_external(node);

    return 0;
}